

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

reference<mpt::metatype> * __thiscall
mpt::reference<mpt::metatype>::operator=
          (reference<mpt::metatype> *this,reference<mpt::metatype> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  metatype *pmVar2;
  metatype *pmVar3;
  
  pmVar3 = ref->_ref;
  pmVar2 = this->_ref;
  if (pmVar3 != pmVar2) {
    if (pmVar3 == (metatype *)0x0) {
      pmVar3 = (metatype *)0x0;
    }
    else {
      iVar1 = (*(pmVar3->super_convertable)._vptr_convertable[2])(pmVar3);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        pmVar3 = (metatype *)0x0;
      }
      pmVar2 = this->_ref;
    }
    if (pmVar2 != (metatype *)0x0) {
      (*(pmVar2->super_convertable)._vptr_convertable[1])();
    }
    this->_ref = pmVar3;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}